

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  secp256k1_scalar *r;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  secp256k1_scalar *r_00;
  secp256k1_ge *psVar3;
  secp256k1_fe *r_01;
  uint64_t *puVar4;
  secp256k1_fe *r_02;
  long lVar5;
  byte bVar6;
  secp256k1_musig_session_internal session_i;
  uchar fin_nonce [32];
  uchar agg_pk32 [32];
  secp256k1_ge fin_nonce_pt;
  secp256k1_scalar e_tmp;
  uchar noncehash [32];
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge aggnonce_pts [2];
  byte local_3a8;
  uint local_384;
  secp256k1_fe local_380;
  secp256k1_ge local_338;
  secp256k1_gej local_2c8;
  uchar local_228 [40];
  secp256k1_keyagg_cache_internal local_200;
  secp256k1_ge local_108 [2];
  
  bVar6 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_nonce_process_cold_7();
  }
  else if (session != (secp256k1_musig_session *)0x0) {
    if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
      secp256k1_musig_nonce_process_cold_5();
      return 0;
    }
    if (msg32 == (uchar *)0x0) {
      secp256k1_musig_nonce_process_cold_4();
      return 0;
    }
    if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
      secp256k1_musig_nonce_process_cold_3();
      return 0;
    }
    iVar1 = secp256k1_keyagg_cache_load(ctx,&local_200,keyagg_cache);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_fe_get_b32((uchar *)&local_380.magnitude,(secp256k1_fe *)&local_200);
    iVar1 = secp256k1_musig_aggnonce_load(ctx,local_108,aggnonce);
    if (iVar1 == 0) {
      return 0;
    }
    local_2c8.x.n[0] = 0x6bf7e532c7d5a45;
    local_2c8.x.n[1] = 0x971254c089be68a6;
    local_2c8.x.n[2] = 0x72846dcd60ac12d2;
    local_2c8.x.n[3] = 0xde7a25006c81212f;
    local_2c8.z.n[0] = 0x40;
    lVar5 = 0;
    do {
      secp256k1_musig_ge_serialize_ext
                ((uchar *)((&local_380)[1].n + 3),(secp256k1_ge *)((long)local_108[0].x.n + lVar5));
      secp256k1_sha256_write((secp256k1_sha256 *)&local_2c8,(uchar *)((&local_380)[1].n + 3),0x21);
      lVar5 = lVar5 + 0x68;
    } while (lVar5 == 0x68);
    secp256k1_sha256_write((secp256k1_sha256 *)&local_2c8,(uchar *)&local_380.magnitude,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)&local_2c8,msg32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)&local_2c8,local_228);
    secp256k1_scalar_set_b32(&local_384,local_228,(int *)0x0);
    secp256k1_effective_nonce(&local_2c8,local_108,&local_384);
    secp256k1_ge_set_gej((secp256k1_ge *)((&local_380)[1].n + 3),&local_2c8);
    secp256k1_ge_verify((secp256k1_ge *)((&local_380)[1].n + 3));
    if (local_338.infinity != 0) {
      psVar3 = &secp256k1_ge_const_g;
      puVar4 = (&local_380)[1].n + 3;
      for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar4 = (psVar3->x).n[0];
        psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      }
    }
    r_01 = (secp256k1_fe *)((&local_380)[1].n + 3);
    secp256k1_fe_normalize_var(r_01);
    secp256k1_fe_get_b32((uchar *)(local_380.n + 1),r_01);
    r_02 = &local_338.y;
    secp256k1_fe_normalize_var(r_02);
    secp256k1_fe_verify(r_02);
    if (local_338.y.normalized == 0) {
      secp256k1_musig_nonce_process_cold_2();
LAB_001124d6:
      secp256k1_musig_nonce_process_cold_1();
      secp256k1_scalar_verify((secp256k1_scalar *)r_01);
      secp256k1_scalar_verify(r_00);
      uVar2 = *r_00 * (int)r_01->n[0];
      *(uint *)r_02->n = uVar2 - (uVar2 / 0xd + (uVar2 / 0xd) * 0xc);
      secp256k1_scalar_verify((secp256k1_scalar *)r_02);
      return extraout_EAX;
    }
    local_3a8 = (byte)local_338.y.n[0] & 1;
    secp256k1_schnorrsig_challenge
              ((secp256k1_scalar *)&local_380,(uchar *)(local_380.n + 1),msg32,0x20,
               (uchar *)&local_380.magnitude);
    r = (secp256k1_scalar *)((long)local_380.n + 4);
    local_380.n[0]._4_4_ = 0;
    secp256k1_scalar_verify(r);
    secp256k1_scalar_verify(&local_200.tweak);
    if (local_200.tweak != 0) {
      r_01 = &local_380;
      secp256k1_scalar_mul
                ((secp256k1_scalar *)&local_2c8,(secp256k1_scalar *)&local_380,&local_200.tweak);
      r_02 = &local_200.pk.y;
      secp256k1_fe_verify(r_02);
      if (local_200.pk.y.normalized == 0) goto LAB_001124d6;
      if (((byte)local_200.pk.y.n[0] & 1) != 0) {
        secp256k1_scalar_verify((secp256k1_scalar *)&local_2c8);
        iVar1 = 0xd - (uint)local_2c8.x.n[0];
        if ((uint)local_2c8.x.n[0] == 0) {
          iVar1 = 0;
        }
        local_2c8.x.n[0] = CONCAT44(local_2c8.x.n[0]._4_4_,iVar1);
        secp256k1_scalar_verify((secp256k1_scalar *)&local_2c8);
      }
      local_380.n[0]._4_4_ = (uint)local_2c8.x.n[0];
    }
    session->data[0] = 0x9d;
    session->data[1] = 0xed;
    session->data[2] = 0xe9;
    session->data[3] = '\x17';
    session->data[4] = local_3a8;
    *(uint64_t *)(session->data + 5) = local_380.n[1];
    *(uint64_t *)(session->data + 0xd) = local_380.n[2];
    *(uint64_t *)(session->data + 0x15) = local_380.n[3];
    *(uint64_t *)(session->data + 0x1d) = local_380.n[4];
    secp256k1_scalar_verify(&local_384);
    session->data[0x35] = '\0';
    session->data[0x36] = '\0';
    session->data[0x37] = '\0';
    session->data[0x38] = '\0';
    session->data[0x39] = '\0';
    session->data[0x3a] = '\0';
    session->data[0x3b] = '\0';
    session->data[0x3c] = '\0';
    session->data[0x3d] = '\0';
    session->data[0x3e] = '\0';
    session->data[0x3f] = '\0';
    session->data[0x40] = '\0';
    session->data[0x41] = '\0';
    session->data[0x42] = '\0';
    session->data[0x43] = '\0';
    session->data[0x44] = '\0';
    session->data[0x25] = '\0';
    session->data[0x26] = '\0';
    session->data[0x27] = '\0';
    session->data[0x28] = '\0';
    session->data[0x29] = '\0';
    session->data[0x2a] = '\0';
    session->data[0x2b] = '\0';
    session->data[0x2c] = '\0';
    session->data[0x2d] = '\0';
    session->data[0x2e] = '\0';
    session->data[0x2f] = '\0';
    session->data[0x30] = '\0';
    session->data[0x31] = '\0';
    session->data[0x32] = '\0';
    session->data[0x33] = '\0';
    session->data[0x34] = '\0';
    *(uint *)(session->data + 0x41) =
         local_384 >> 0x18 | (local_384 & 0xff0000) >> 8 | (local_384 & 0xff00) << 8 |
         local_384 << 0x18;
    secp256k1_scalar_verify((secp256k1_scalar *)&local_380);
    session->data[0x55] = '\0';
    session->data[0x56] = '\0';
    session->data[0x57] = '\0';
    session->data[0x58] = '\0';
    session->data[0x59] = '\0';
    session->data[0x5a] = '\0';
    session->data[0x5b] = '\0';
    session->data[0x5c] = '\0';
    session->data[0x5d] = '\0';
    session->data[0x5e] = '\0';
    session->data[0x5f] = '\0';
    session->data[0x60] = '\0';
    session->data[0x61] = '\0';
    session->data[0x62] = '\0';
    session->data[99] = '\0';
    session->data[100] = '\0';
    session->data[0x45] = '\0';
    session->data[0x46] = '\0';
    session->data[0x47] = '\0';
    session->data[0x48] = '\0';
    session->data[0x49] = '\0';
    session->data[0x4a] = '\0';
    session->data[0x4b] = '\0';
    session->data[0x4c] = '\0';
    session->data[0x4d] = '\0';
    session->data[0x4e] = '\0';
    session->data[0x4f] = '\0';
    session->data[0x50] = '\0';
    session->data[0x51] = '\0';
    session->data[0x52] = '\0';
    session->data[0x53] = '\0';
    session->data[0x54] = '\0';
    *(uint *)(session->data + 0x61) =
         (uint)local_380.n[0] >> 0x18 | ((uint)local_380.n[0] & 0xff0000) >> 8 |
         ((uint)local_380.n[0] & 0xff00) << 8 | (uint)local_380.n[0] << 0x18;
    secp256k1_scalar_verify(r);
    session->data[0x75] = '\0';
    session->data[0x76] = '\0';
    session->data[0x77] = '\0';
    session->data[0x78] = '\0';
    session->data[0x79] = '\0';
    session->data[0x7a] = '\0';
    session->data[0x7b] = '\0';
    session->data[0x7c] = '\0';
    session->data[0x7d] = '\0';
    session->data[0x7e] = '\0';
    session->data[0x7f] = '\0';
    session->data[0x80] = '\0';
    session->data[0x81] = '\0';
    session->data[0x82] = '\0';
    session->data[0x83] = '\0';
    session->data[0x84] = '\0';
    session->data[0x65] = '\0';
    session->data[0x66] = '\0';
    session->data[0x67] = '\0';
    session->data[0x68] = '\0';
    session->data[0x69] = '\0';
    session->data[0x6a] = '\0';
    session->data[0x6b] = '\0';
    session->data[0x6c] = '\0';
    session->data[0x6d] = '\0';
    session->data[0x6e] = '\0';
    session->data[0x6f] = '\0';
    session->data[0x70] = '\0';
    session->data[0x71] = '\0';
    session->data[0x72] = '\0';
    session->data[0x73] = '\0';
    session->data[0x74] = '\0';
    *(uint *)(session->data + 0x81) =
         local_380.n[0]._4_4_ >> 0x18 | (local_380.n[0]._4_4_ & 0xff0000) >> 8 |
         (local_380.n[0]._4_4_ & 0xff00) << 8 | local_380.n[0]._4_4_ << 0x18;
    return 1;
  }
  secp256k1_musig_nonce_process_cold_6();
  return 0;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}